

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O0

void __thiscall
spvtools::opt::analysis::Array::Array(Array *this,Type *type,LengthInfo *length_info_arg)

{
  int iVar1;
  undefined4 extraout_var;
  size_type sVar2;
  LengthInfo *length_info_arg_local;
  Type *type_local;
  Array *this_local;
  
  Type::Type(&this->super_Type,kArray);
  (this->super_Type)._vptr_Type = (_func_int **)&PTR__Array_0082aa58;
  this->element_type_ = type;
  LengthInfo::LengthInfo(&this->length_info_,length_info_arg);
  if (type == (Type *)0x0) {
    __assert_fail("type != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/types.cpp"
                  ,0x1a5,
                  "spvtools::opt::analysis::Array::Array(const Type *, const Array::LengthInfo &)");
  }
  iVar1 = (*type->_vptr_Type[6])();
  if (CONCAT44(extraout_var,iVar1) != 0) {
    __assert_fail("!type->AsVoid()",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/types.cpp"
                  ,0x1a6,
                  "spvtools::opt::analysis::Array::Array(const Type *, const Array::LengthInfo &)");
  }
  sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&length_info_arg->words);
  if (1 < sVar2) {
    return;
  }
  __assert_fail("length_info_arg.words.size() >= 2",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/types.cpp"
                ,0x1a9,
                "spvtools::opt::analysis::Array::Array(const Type *, const Array::LengthInfo &)");
}

Assistant:

Array::Array(const Type* type, const Array::LengthInfo& length_info_arg)
    : Type(kArray), element_type_(type), length_info_(length_info_arg) {
  assert(type != nullptr);
  assert(!type->AsVoid());
  // We always have a word to say which case we're in, followed
  // by at least one more word.
  assert(length_info_arg.words.size() >= 2);
}